

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

Promise<int> __thiscall kj::UnixEventPort::onChildExit(UnixEventPort *this,Maybe<int> *pid)

{
  NullableValue<int> params;
  Maybe<int> *in_RDX;
  Own<kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>_> OVar1;
  Promise<int> PVar2;
  Fault f;
  EventPort local_28;
  _func_int **pp_Stack_20;
  
  if ((anonymous_namespace)::capturedChildExit == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
              ((Fault *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xa6,FAILED,"capturedChildExit",
               "\"must call UnixEventPort::captureChildExit() to use onChildExit().\"",
               (char (*) [66])"must call UnixEventPort::captureChildExit() to use onChildExit().");
    kj::_::Debug::Fault::fatal((Fault *)&local_28);
  }
  if (pid[0x1b].ptr == (NullableValue<int>)0x0) {
    if ((anonymous_namespace)::threadClaimedChildExits == '\x01') {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                ((Fault *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0xaf,FAILED,"!threadClaimedChildExits",
                 "\"only one UnixEvertPort per process may listen for child exits\"",
                 (char (*) [62])"only one UnixEvertPort per process may listen for child exits");
      kj::_::Debug::Fault::fatal((Fault *)&local_28);
    }
    (anonymous_namespace)::threadClaimedChildExits = '\x01';
    params = (NullableValue<int>)operator_new(0x30);
    *(undefined8 *)((long)params + 0x10) = 0;
    *(undefined8 *)((long)params + 0x18) = 0;
    *(undefined8 *)((long)params + 0x20) = 0;
    *(undefined8 *)((long)params + 0x28) = 0;
    *(undefined8 *)params = 0;
    *(undefined8 *)((long)params + 8) = 0;
    *(undefined8 **)((long)params + 0x18) = (undefined8 *)((long)params + 8);
    *(undefined8 **)((long)params + 0x20) = (undefined8 *)((long)params + 8);
    *(undefined8 *)((long)params + 0x28) = 0;
    pid[0x1a].ptr = (NullableValue<int>)&kj::_::HeapDisposer<kj::UnixEventPort::ChildSet>::instance;
    pid[0x1b].ptr = params;
  }
  else {
    params = pid[0x1b].ptr;
  }
  OVar1 = heap<kj::_::AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>,kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
                    ((kj *)&local_28,(ChildSet *)params,in_RDX);
  PVar2.super_PromiseBase.node.ptr = OVar1.ptr;
  (this->super_EventPort)._vptr_EventPort = local_28._vptr_EventPort;
  (this->timerImpl).super_Timer._vptr_Timer = pp_Stack_20;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<int>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<int> UnixEventPort::onChildExit(Maybe<pid_t>& pid) {
  KJ_REQUIRE(capturedChildExit,
      "must call UnixEventPort::captureChildExit() to use onChildExit().");

  ChildSet* cs;
  KJ_IF_MAYBE(c, childSet) {
    cs = *c;
  } else {
    // In theory we should do an atomic compare-and-swap on threadClaimedChildExits, but this is
    // for debug purposes only so it's not a big deal.
    KJ_REQUIRE(!threadClaimedChildExits,
        "only one UnixEvertPort per process may listen for child exits");
    threadClaimedChildExits = true;

    auto newChildSet = kj::heap<ChildSet>();
    cs = newChildSet;
    childSet = kj::mv(newChildSet);
  }